

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_aef201::HandleArchiveCreateCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *key;
  string *__k;
  string *b;
  bool bVar1;
  int iVar2;
  iterator iVar3;
  cmTarCompression cVar4;
  bool bVar5;
  _Rb_tree_color compressType;
  long lVar6;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>_>
  __l;
  int minCompressionLevel;
  cmTarCompression local_254;
  allocator_type local_24e;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_24d;
  cmTarCompression local_24c;
  _Any_data local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_238;
  Arguments *local_230;
  undefined8 local_228;
  undefined1 auStack_220 [32];
  undefined8 uStack_200;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
  local_1f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
  local_1d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
  local_1a8;
  cmTarCompression local_180 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unrecognizedArguments;
  Arguments parsedArgs;
  char *zipFileFormats [2];
  char *knownFormats [6];
  
  if ((anonymous_namespace)::
      HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
      ::parser == '\0') {
    iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                 ::parser);
    if (iVar2 != 0) {
      parsedArgs.Format.field_2._M_allocated_capacity = 0;
      parsedArgs.Format.field_2._8_8_ = 0;
      parsedArgs.Format._M_dataplus._M_p = (pointer)0x0;
      parsedArgs.Format._M_string_length = 0;
      parsedArgs.Output.field_2._M_allocated_capacity = 0;
      parsedArgs.Output.field_2._8_8_ = 0;
      parsedArgs.Output._M_dataplus._M_p = (pointer)0x0;
      parsedArgs.Output._M_string_length = 0;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = (_Base_ptr)0x0;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_node_count =
           0;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = (_Base_ptr)0x0;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = (_Base_ptr)0x0;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl._0_8_ = 0;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_color = _S_red;
      parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._4_4_
           = 0;
      name.super_string_view._M_str = "OUTPUT";
      name.super_string_view._M_len = 6;
      cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)&parsedArgs,name,0x30);
      name_00.super_string_view._M_str = "FORMAT";
      name_00.super_string_view._M_len = 6;
      cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)&parsedArgs,name_00,0x50);
      name_01.super_string_view._M_str = "COMPRESSION";
      name_01.super_string_view._M_len = 0xb;
      cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)&parsedArgs,name_01,0x70);
      name_02.super_string_view._M_str = "COMPRESSION_LEVEL";
      name_02.super_string_view._M_len = 0x11;
      cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
      ::Bind<std::__cxx11::string>
                ((cmArgumentParser<(anonymous_namespace)::HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                  *)&parsedArgs,name_02,0x90);
      local_248._8_8_ = 0;
      local_248._M_unused._M_member_pointer = 0xb0;
      local_230 = (Arguments *)
                  std::
                  _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
                  ::_M_invoke;
      local_238 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)std::
                     _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
                     ::_M_manager;
      name_03._M_str = "MTIME";
      name_03._M_len = 5;
      ArgumentParser::Base::Bind((Base *)&parsedArgs,name_03,(KeywordAction *)&local_248);
      std::_Function_base::~_Function_base((_Function_base *)&local_248);
      local_248._8_8_ = 0;
      local_248._M_unused._M_member_pointer = 0xd0;
      local_230 = (Arguments *)
                  std::
                  _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
                  ::_M_invoke;
      local_238 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)std::
                     _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
                     ::_M_manager;
      name_04._M_str = "VERBOSE";
      name_04._M_len = 7;
      ArgumentParser::Base::Bind((Base *)&parsedArgs,name_04,(KeywordAction *)&local_248);
      std::_Function_base::~_Function_base((_Function_base *)&local_248);
      local_248._8_8_ = 0;
      local_248._M_unused._M_member_pointer = 0xd8;
      local_230 = (Arguments *)
                  std::
                  _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
                  ::_M_invoke;
      local_238 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)std::
                     _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmArgumentParser.h:250:28)>
                     ::_M_manager;
      name_05._M_str = "PATHS";
      name_05._M_len = 5;
      ArgumentParser::Base::Bind((Base *)&parsedArgs,name_05,(KeywordAction *)&local_248);
      std::_Function_base::~_Function_base((_Function_base *)&local_248);
      ArgumentParser::ActionMap::ActionMap
                ((ActionMap *)&HandleArchiveCreateCommand::parser,(ActionMap *)&parsedArgs);
      ArgumentParser::ActionMap::~ActionMap((ActionMap *)&parsedArgs);
      __cxa_atexit(ArgumentParser::Base::~Base,&HandleArchiveCreateCommand::parser,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::parser);
    }
  }
  local_238 = &unrecognizedArguments;
  unrecognizedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  unrecognizedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unrecognizedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  knownFormats[1] =
       (char *)(args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header;
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._0_8_
       & 0xffffffff00000000;
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
       = (_Base_ptr)0x0;
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  parsedArgs.Output._M_dataplus._M_p = (pointer)&parsedArgs.Output.field_2;
  parsedArgs.Output._M_string_length = 0;
  parsedArgs.Output.field_2._M_allocated_capacity =
       parsedArgs.Output.field_2._M_allocated_capacity & 0xffffffffffffff00;
  parsedArgs.Format._M_dataplus._M_p = (pointer)&parsedArgs.Format.field_2;
  parsedArgs.Format._M_string_length = 0;
  parsedArgs.Format.field_2._M_allocated_capacity =
       parsedArgs.Format.field_2._M_allocated_capacity & 0xffffffffffffff00;
  parsedArgs.Compression._M_dataplus._M_p = (pointer)&parsedArgs.Compression.field_2;
  parsedArgs.Compression._M_string_length = 0;
  parsedArgs.Compression.field_2._M_local_buf[0] = '\0';
  parsedArgs.CompressionLevel._M_dataplus._M_p = (pointer)&parsedArgs.CompressionLevel.field_2;
  parsedArgs.CompressionLevel._M_string_length = 0;
  knownFormats[0] =
       (char *)((args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + 1);
  parsedArgs.CompressionLevel.field_2._M_local_buf[0] = '\0';
  parsedArgs.MTime.super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>.
  _M_dataplus._M_p =
       (pointer)&parsedArgs.MTime.
                 super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>.field_2;
  parsedArgs.MTime.super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>.
  _M_string_length = 0;
  parsedArgs.MTime.super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>.field_2.
  _M_local_buf[0] = '\0';
  parsedArgs.Verbose = false;
  parsedArgs.Paths.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parsedArgs.Paths.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  parsedArgs.Paths.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_248._M_unused._M_object = &HandleArchiveCreateCommand::parser;
  local_248._8_8_ = &parsedArgs;
  local_228 = 0;
  auStack_220._0_8_ = (pointer)0x0;
  auStack_220._8_8_ = 0;
  auStack_220._16_8_ = 0;
  auStack_220._24_8_ = 0;
  uStack_200._0_4_ = TarCompressGZip;
  uStack_200._4_4_ = 0;
  local_1f8.first._M_dataplus._M_p = (pointer)0x0;
  local_1f8.first._M_string_length = 0;
  local_1f8.first.field_2._M_local_buf[0] = '\0';
  local_230 = (Arguments *)local_248._8_8_;
  parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
       _M_left;
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Instance *)&local_248,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)knownFormats,0);
  std::_Function_base::~_Function_base((_Function_base *)(auStack_220 + 0x18));
  if (unrecognizedArguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      unrecognizedArguments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar1 = ArgumentParser::ParseResult::MaybeReportError
                      (&parsedArgs.super_ParseResult,status->Makefile);
    if (bVar1) {
      cmSystemTools::s_FatalErrorOccurred = true;
      bVar5 = true;
      goto LAB_002e326e;
    }
    key = &parsedArgs.Format;
    knownFormats[4] = "raw";
    knownFormats[5] = "zip";
    knownFormats[2] = "pax";
    knownFormats[3] = "paxr";
    knownFormats[0] = "7zip";
    knownFormats[1] = "gnutar";
    if (parsedArgs.Format._M_string_length != 0) {
      bVar1 = ::cm::
              contains<const_char_*[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&knownFormats,key);
      if (!bVar1) {
        cmStrCat<char_const(&)[16],std::__cxx11::string&,char_const(&)[15]>
                  ((string *)&local_248,(char (*) [16])"archive format ",key,(char (*) [15])0x75f632
                  );
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_002e3258;
      }
    }
    zipFileFormats[0] = "7zip";
    zipFileFormats[1] = "zip";
    if (parsedArgs.Compression._M_string_length != 0) {
      bVar1 = ::cm::
              contains<const_char_*[2],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&zipFileFormats,key);
      if (bVar1) {
        cmStrCat<char_const(&)[16],std::__cxx11::string&,char_const(&)[40]>
                  ((string *)&local_248,(char (*) [16])"archive format ",key,
                   (char (*) [40])" does not support COMPRESSION arguments");
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_002e3258;
      }
    }
    if ((anonymous_namespace)::
        HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
        ::compressionTypeMap_abi_cxx11_ == '\0') {
      iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::compressionTypeMap_abi_cxx11_);
      if (iVar2 != 0) {
        minCompressionLevel = 4;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
        ::pair<const_char_(&)[5],_cmSystemTools::cmTarCompression,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
                    *)&local_248,(char (*) [5])0x7108d1,(cmTarCompression *)&minCompressionLevel);
        local_254 = TarCompressBZip2;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
        ::pair<const_char_(&)[6],_cmSystemTools::cmTarCompression,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
                    *)auStack_220,(char (*) [6])"BZip2",&local_254);
        local_24c = TarCompressGZip;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
        ::pair<const_char_(&)[5],_cmSystemTools::cmTarCompression,_true>
                  (&local_1f8,(char (*) [5])"GZip",&local_24c);
        local_180[1] = 2;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
        ::pair<const_char_(&)[3],_cmSystemTools::cmTarCompression,_true>
                  (&local_1d0,(char (*) [3])0x6b0d75,local_180 + 1);
        local_180[0] = TarCompressZstd;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>
        ::pair<const_char_(&)[5],_cmSystemTools::cmTarCompression,_true>
                  (&local_1a8,(char (*) [5])"Zstd",local_180);
        __l._M_len = 5;
        __l._M_array = (iterator)&local_248;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>_>_>
        ::map(&(anonymous_namespace)::
               HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
               ::compressionTypeMap_abi_cxx11_,__l,&local_24d,&local_24e);
        lVar6 = 0xa0;
        do {
          std::__cxx11::string::~string((string *)((long)&local_248 + lVar6));
          lVar6 = lVar6 + -0x28;
        } while (lVar6 != -0x28);
        __cxa_atexit(std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>_>_>
                     ::~map,&(anonymous_namespace)::
                             HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                             ::compressionTypeMap_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&(anonymous_namespace)::
                             HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                             ::compressionTypeMap_abi_cxx11_);
      }
    }
    __k = &parsedArgs.Compression;
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSystemTools::cmTarCompression>_>_>
            ::find(&(anonymous_namespace)::
                    HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                    ::compressionTypeMap_abi_cxx11_._M_t,__k);
    cVar4 = 9;
    if ((_Rb_tree_header *)iVar3._M_node ==
        &(anonymous_namespace)::
         HandleArchiveCreateCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
         ::compressionTypeMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
      if (parsedArgs.Compression._M_string_length != 0) {
        cmStrCat<char_const(&)[18],std::__cxx11::string&,char_const(&)[18]>
                  ((string *)&local_248,(char (*) [18])"compression type ",__k,
                   (char (*) [18])0x738cfa);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_002e3258;
      }
      compressType = 4;
    }
    else {
      compressType = iVar3._M_node[2]._M_color;
      if (compressType == 3) {
        cVar4 = 0x13;
      }
    }
    minCompressionLevel = 0;
    local_254 = cVar4;
    if (parsedArgs.CompressionLevel._M_string_length == 0) {
      iVar2 = 0;
LAB_002e34b8:
      if (parsedArgs.Paths.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          parsedArgs.Paths.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_248._M_pod_data,
                   "ARCHIVE_CREATE requires a non-empty list of PATHS",(allocator<char> *)&local_24c
                  );
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
      else {
        bVar1 = cmSystemTools::CreateTar
                          (&parsedArgs.Output,
                           &parsedArgs.Paths.
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ,compressType,parsedArgs.Verbose,
                           &parsedArgs.MTime.
                            super_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,
                           key,iVar2);
        bVar5 = true;
        if (bVar1) goto LAB_002e326e;
        cmStrCat<char_const(&)[21],std::__cxx11::string&>
                  ((string *)&local_248,(char (*) [21])"failed to compress: ",&parsedArgs.Output);
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
    }
    else {
      b = &parsedArgs.CompressionLevel;
      if ((parsedArgs.CompressionLevel._M_string_length == 1) ||
         ((int)*parsedArgs.CompressionLevel._M_dataplus._M_p - 0x30U < 10)) {
        iVar2 = std::__cxx11::stoi(b,(size_t *)0x0,10);
        if ((iVar2 < minCompressionLevel) || ((int)local_254 < iVar2)) {
          cmStrCat<char_const(&)[19],std::__cxx11::string&,char_const(&)[6],std::__cxx11::string&,char_const(&)[21],int&,char_const(&)[5],int&>
                    ((string *)&local_248,(char (*) [19])"compression level ",b,
                     (char (*) [6])0x6c6f1c,__k,(char (*) [21])" should be in range ",
                     &minCompressionLevel,(char (*) [5])0x6edca5,(int *)&local_254);
          std::__cxx11::string::_M_assign((string *)&status->Error);
        }
        else {
          if (compressType != 4) goto LAB_002e34b8;
          cmStrCat<char_const(&)[58],std::__cxx11::string&>
                    ((string *)&local_248,
                     (char (*) [58])"compression level is not supported for compression \"None\"",
                     __k);
          std::__cxx11::string::_M_assign((string *)&status->Error);
        }
      }
      else {
        cmStrCat<char_const(&)[19],std::__cxx11::string&,char_const(&)[6],std::__cxx11::string&,char_const(&)[21],int&,char_const(&)[5],int&>
                  ((string *)&local_248,(char (*) [19])"compression level ",b,(char (*) [6])0x6c6f1c
                   ,__k,(char (*) [21])" should be in range ",&minCompressionLevel,
                   (char (*) [5])0x6edca5,(int *)&local_254);
        std::__cxx11::string::_M_assign((string *)&status->Error);
      }
    }
  }
  else {
    cmStrCat<char_const(&)[25],std::__cxx11::string&,char_const(&)[2]>
              ((string *)&local_248,(char (*) [25])0x6e5832,
               unrecognizedArguments.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,(char (*) [2])0x70274e);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
LAB_002e3258:
  std::__cxx11::string::~string((string *)local_248._M_pod_data);
  cmSystemTools::s_FatalErrorOccurred = true;
  bVar5 = false;
LAB_002e326e:
  HandleArchiveCreateCommand::Arguments::~Arguments(&parsedArgs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unrecognizedArguments);
  return bVar5;
}

Assistant:

bool HandleArchiveCreateCommand(std::vector<std::string> const& args,
                                cmExecutionStatus& status)
{
  struct Arguments : public ArgumentParser::ParseResult
  {
    std::string Output;
    std::string Format;
    std::string Compression;
    std::string CompressionLevel;
    // "MTIME" should require one value, but it has long been accidentally
    // accepted without one and treated as if an empty value were given.
    // Fixing this would require a policy.
    ArgumentParser::Maybe<std::string> MTime;
    bool Verbose = false;
    // "PATHS" requires at least one value, but use a custom check below.
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Paths;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("OUTPUT"_s, &Arguments::Output)
      .Bind("FORMAT"_s, &Arguments::Format)
      .Bind("COMPRESSION"_s, &Arguments::Compression)
      .Bind("COMPRESSION_LEVEL"_s, &Arguments::CompressionLevel)
      .Bind("MTIME"_s, &Arguments::MTime)
      .Bind("VERBOSE"_s, &Arguments::Verbose)
      .Bind("PATHS"_s, &Arguments::Paths);

  std::vector<std::string> unrecognizedArguments;
  auto parsedArgs =
    parser.Parse(cmMakeRange(args).advance(1), &unrecognizedArguments);
  auto argIt = unrecognizedArguments.begin();
  if (argIt != unrecognizedArguments.end()) {
    status.SetError(cmStrCat("Unrecognized argument: \"", *argIt, "\""));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (parsedArgs.MaybeReportError(status.GetMakefile())) {
    cmSystemTools::SetFatalErrorOccurred();
    return true;
  }

  const char* knownFormats[] = {
    "7zip", "gnutar", "pax", "paxr", "raw", "zip"
  };

  if (!parsedArgs.Format.empty() &&
      !cm::contains(knownFormats, parsedArgs.Format)) {
    status.SetError(
      cmStrCat("archive format ", parsedArgs.Format, " not supported"));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  const char* zipFileFormats[] = { "7zip", "zip" };
  if (!parsedArgs.Compression.empty() &&
      cm::contains(zipFileFormats, parsedArgs.Format)) {
    status.SetError(cmStrCat("archive format ", parsedArgs.Format,
                             " does not support COMPRESSION arguments"));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  static std::map<std::string, cmSystemTools::cmTarCompression>
    compressionTypeMap = { { "None", cmSystemTools::TarCompressNone },
                           { "BZip2", cmSystemTools::TarCompressBZip2 },
                           { "GZip", cmSystemTools::TarCompressGZip },
                           { "XZ", cmSystemTools::TarCompressXZ },
                           { "Zstd", cmSystemTools::TarCompressZstd } };

  cmSystemTools::cmTarCompression compress = cmSystemTools::TarCompressNone;
  auto typeIt = compressionTypeMap.find(parsedArgs.Compression);
  if (typeIt != compressionTypeMap.end()) {
    compress = typeIt->second;
  } else if (!parsedArgs.Compression.empty()) {
    status.SetError(cmStrCat("compression type ", parsedArgs.Compression,
                             " is not supported"));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  int compressionLevel = 0;
  int minCompressionLevel = 0;
  int maxCompressionLevel = 9;
  if (compress == cmSystemTools::TarCompressZstd) {
    maxCompressionLevel = 19;
  }

  if (!parsedArgs.CompressionLevel.empty()) {
    if (parsedArgs.CompressionLevel.size() != 1 &&
        !std::isdigit(parsedArgs.CompressionLevel[0])) {
      status.SetError(
        cmStrCat("compression level ", parsedArgs.CompressionLevel, " for ",
                 parsedArgs.Compression, " should be in range ",
                 minCompressionLevel, " to ", maxCompressionLevel));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
    compressionLevel = std::stoi(parsedArgs.CompressionLevel);
    if (compressionLevel < minCompressionLevel ||
        compressionLevel > maxCompressionLevel) {
      status.SetError(
        cmStrCat("compression level ", parsedArgs.CompressionLevel, " for ",
                 parsedArgs.Compression, " should be in range ",
                 minCompressionLevel, " to ", maxCompressionLevel));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
    if (compress == cmSystemTools::TarCompressNone) {
      status.SetError(cmStrCat("compression level is not supported for "
                               "compression \"None\"",
                               parsedArgs.Compression));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
  }

  if (parsedArgs.Paths.empty()) {
    status.SetError("ARCHIVE_CREATE requires a non-empty list of PATHS");
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (!cmSystemTools::CreateTar(parsedArgs.Output, parsedArgs.Paths, compress,
                                parsedArgs.Verbose, parsedArgs.MTime,
                                parsedArgs.Format, compressionLevel)) {
    status.SetError(cmStrCat("failed to compress: ", parsedArgs.Output));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  return true;
}